

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O1

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ImageTemplate<unsigned_char> local_50;
  
  uVar1 = *width;
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
  local_50._data = (uchar *)0x0;
  local_50._type = args->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy
            (&local_50,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)image);
  if ((image->_rowSize == uVar1) && (local_50._rowSize == uVar1)) {
    uVar2 = *width;
    uVar3 = *height;
    local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
    if (uVar2 < (uint)(0xffffffff / (ulong)uVar3)) {
      *width = *height * *width;
      *height = 1;
    }
  }
  else {
    local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }